

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O1

bool __thiscall RTIMUGD20M303DLHC::setCompassCRA(RTIMUGD20M303DLHC *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20M303DLHCCompassSampleRate;
  if (uVar1 < 8) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_compassSlaveAddr,'\0',
                               (char)uVar1 << 2,"Failed to set LSM303DLHC CRA_M");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM303DLHC compass sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20M303DLHC::setCompassCRA()
{
    unsigned char cra;

    if ((m_settings->m_GD20M303DLHCCompassSampleRate < 0) || (m_settings->m_GD20M303DLHCCompassSampleRate > 7)) {
        HAL_ERROR1("Illegal LSM303DLHC compass sample rate code %d\n", m_settings->m_GD20M303DLHCCompassSampleRate);
        return false;
    }

    cra = (m_settings->m_GD20M303DLHCCompassSampleRate << 2);

    return m_settings->HALWrite(m_compassSlaveAddr,  LSM303DLHC_CRA_M, cra, "Failed to set LSM303DLHC CRA_M");
}